

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O0

int Get5TelemetersParallelSRF02
              (SRF02 *pSRF02,double *pDist1,double *pDist2,double *pDist3,double *pDist4,
              double *pDist5)

{
  int iVar1;
  double *pDist5_local;
  double *pDist4_local;
  double *pDist3_local;
  double *pDist2_local;
  double *pDist1_local;
  SRF02 *pSRF02_local;
  
  iVar1 = SendRangeRequestSRF02(pSRF02,0);
  if (iVar1 == 0) {
    iVar1 = SendRangeRequestSRF02(pSRF02,1);
    if (iVar1 == 0) {
      iVar1 = SendRangeRequestSRF02(pSRF02,2);
      if (iVar1 == 0) {
        iVar1 = SendRangeRequestSRF02(pSRF02,3);
        if (iVar1 == 0) {
          iVar1 = SendRangeRequestSRF02(pSRF02,4);
          if (iVar1 == 0) {
            mSleep((long)pSRF02->RangingDelay);
            iVar1 = RangeReplySRF02(pSRF02,0,pDist1);
            if (iVar1 == 0) {
              iVar1 = RangeReplySRF02(pSRF02,1,pDist2);
              if (iVar1 == 0) {
                iVar1 = RangeReplySRF02(pSRF02,2,pDist3);
                if (iVar1 == 0) {
                  iVar1 = RangeReplySRF02(pSRF02,3,pDist4);
                  if (iVar1 == 0) {
                    iVar1 = RangeReplySRF02(pSRF02,4,pDist5);
                    if (iVar1 == 0) {
                      pSRF02_local._4_4_ = 0;
                    }
                    else {
                      pSRF02_local._4_4_ = 1;
                    }
                  }
                  else {
                    pSRF02_local._4_4_ = 1;
                  }
                }
                else {
                  pSRF02_local._4_4_ = 1;
                }
              }
              else {
                pSRF02_local._4_4_ = 1;
              }
            }
            else {
              pSRF02_local._4_4_ = 1;
            }
          }
          else {
            pSRF02_local._4_4_ = 1;
          }
        }
        else {
          pSRF02_local._4_4_ = 1;
        }
      }
      else {
        pSRF02_local._4_4_ = 1;
      }
    }
    else {
      pSRF02_local._4_4_ = 1;
    }
  }
  else {
    pSRF02_local._4_4_ = 1;
  }
  return pSRF02_local._4_4_;
}

Assistant:

inline int Get5TelemetersParallelSRF02(SRF02* pSRF02, double* pDist1, double* pDist2, double* pDist3, double* pDist4, double* pDist5)
{
	if (SendRangeRequestSRF02(pSRF02, 0) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 1) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 2) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 3) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (SendRangeRequestSRF02(pSRF02, 4) != EXIT_SUCCESS) return EXIT_FAILURE;
	mSleep(pSRF02->RangingDelay);
	if (RangeReplySRF02(pSRF02, 0, pDist1) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 1, pDist2) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 2, pDist3) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 3, pDist4) != EXIT_SUCCESS) return EXIT_FAILURE;
	if (RangeReplySRF02(pSRF02, 4, pDist5) != EXIT_SUCCESS) return EXIT_FAILURE;

	return EXIT_SUCCESS;
}